

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  float *pfVar1;
  ImRect *pIVar2;
  ImVec2 *pIVar3;
  char cVar4;
  uint uVar5;
  ImGuiWindow *pIVar6;
  ImDrawList *draw_list;
  ImVec2 IVar7;
  ImU32 IVar8;
  ulong uVar9;
  ImGuiCol idx;
  ImGuiTableColumn *pIVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImRect outer_border;
  ImVec2 local_60;
  float local_54;
  float local_50;
  float local_4c;
  ImVec2 local_48;
  ImVec2 aIStack_40 [2];
  
  pIVar6 = table->OuterWindow;
  fVar13 = (pIVar6->ClipRect).Max.y;
  pfVar1 = &(table->OuterRect).Min.y;
  if (fVar13 < *pfVar1 || fVar13 == *pfVar1) {
    return;
  }
  fVar13 = (table->OuterRect).Max.y;
  pfVar1 = &(pIVar6->ClipRect).Min.y;
  if (fVar13 < *pfVar1 || fVar13 == *pfVar1) {
    return;
  }
  pIVar2 = &table->OuterRect;
  fVar13 = (pIVar6->ClipRect).Max.x;
  if (fVar13 < (pIVar2->Min).x || fVar13 == (pIVar2->Min).x) {
    return;
  }
  fVar13 = (table->OuterRect).Max.x;
  if (fVar13 < (pIVar6->ClipRect).Min.x || fVar13 == (pIVar6->ClipRect).Min.x) {
    return;
  }
  draw_list = table->InnerWindow->DrawList;
  ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,draw_list,0);
  ImDrawList::PushClipRect
            (draw_list,(table->Bg0ClipRectForDrawCmd).Min,(table->Bg0ClipRectForDrawCmd).Max,false);
  fVar13 = (table->InnerRect).Min.y;
  fVar14 = (table->InnerRect).Max.y;
  local_4c = fVar13;
  if (table->IsUsingHeaders == true) {
    fVar12 = fVar13;
    if (table->FreezeRowsCount < '\x01') {
      fVar12 = (table->WorkRect).Min.y;
    }
    fVar12 = fVar12 + table->LastFirstRowHeight;
    local_4c = fVar14;
    if (fVar12 <= fVar14) {
      local_4c = fVar12;
    }
  }
  if (((table->Flags & 0x200) != 0) && (0 < table->ColumnsCount)) {
    uVar9 = 0;
    local_54 = fVar14;
    local_50 = fVar13;
    do {
      if ((table->EnabledMaskByDisplayOrder >> (uVar9 & 0x3f) & 1) != 0) {
        cVar4 = (table->DisplayOrderToIndex).Data[uVar9];
        if (table->ResizedColumn == cVar4) {
          bVar11 = table->InstanceInteracted == table->InstanceCurrent;
        }
        else {
          bVar11 = false;
        }
        pIVar10 = (table->Columns).Data + cVar4;
        fVar12 = pIVar10->MaxX;
        pIVar3 = &(table->InnerClipRect).Max;
        if ((((bool)((fVar12 < pIVar3->x || fVar12 == pIVar3->x) | bVar11)) &&
            (((pIVar10->NextEnabledColumn != -1 || ((pIVar10->Flags & 0x40000010U) == 0)) ||
             ((table->Flags & 0x1e000U) == 0x4000)))) && ((pIVar10->ClipRect).Min.x < fVar12)) {
          fVar12 = fVar14;
          if (((table->FreezeColumnsCount == -1 ||
               uVar9 + 1 != (ulong)(uint)(int)table->FreezeColumnsCount) && !bVar11) &&
              table->HoveredColumnBorder != cVar4) {
            bVar11 = (table->Flags & 0x1800) == 0;
            if (!bVar11) {
              fVar12 = local_4c;
            }
            IVar8 = table->RowBgColor[(ulong)bVar11 + 2];
          }
          else {
            if (bVar11) {
              idx = 0x1d;
            }
            else {
              if (table->HoveredColumnBorder != cVar4) {
                IVar8 = table->BorderColorStrong;
                goto LAB_0021ccde;
              }
              idx = 0x1c;
            }
            IVar8 = GetColorU32(idx,1.0);
            fVar12 = local_54;
            fVar13 = local_50;
            fVar14 = local_54;
          }
LAB_0021ccde:
          if (fVar13 < fVar12) {
            local_48.x = pIVar10->MaxX;
            local_60.y = fVar12;
            local_60.x = pIVar10->MaxX;
            local_48.y = fVar13;
            ImDrawList::AddLine(draw_list,&local_48,&local_60,IVar8,1.0);
            fVar13 = local_50;
            fVar14 = local_54;
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)table->ColumnsCount);
  }
  uVar5 = table->Flags;
  if ((uVar5 & 0x500) != 0) {
    IVar7 = (table->OuterRect).Max;
    local_48.x = (pIVar2->Min).x;
    local_48.y = (pIVar2->Min).y;
    aIStack_40[0].x = IVar7.x;
    aIStack_40[0].y = IVar7.y;
    IVar8 = table->BorderColorStrong;
    if ((uVar5 & 0x500) == 0x500) {
      ImDrawList::AddRect(draw_list,&local_48,aIStack_40,IVar8,0.0,-1,1.0);
    }
    else {
      if ((uVar5 >> 10 & 1) == 0) {
        if ((uVar5 >> 8 & 1) == 0) goto LAB_0021ce5c;
        local_60.y = local_48.y;
        local_60.x = aIStack_40[0].x;
        ImDrawList::AddLine(draw_list,&local_48,&local_60,IVar8,1.0);
        local_60.y = aIStack_40[0].y;
        local_60.x = local_48.x;
      }
      else {
        local_60.y = aIStack_40[0].y;
        local_60.x = local_48.x;
        ImDrawList::AddLine(draw_list,&local_48,&local_60,IVar8,1.0);
        local_60.y = local_48.y;
        local_60.x = aIStack_40[0].x;
      }
      ImDrawList::AddLine(draw_list,&local_60,aIStack_40,IVar8,1.0);
    }
  }
LAB_0021ce5c:
  if ((((table->Flags & 0x80) != 0) && (fVar13 = table->RowPosY2, fVar13 < (table->OuterRect).Max.y)
      ) && (((table->BgClipRect).Min.y <= fVar13 && (fVar13 < (table->BgClipRect).Max.y)))) {
    local_48.x = table->BorderX1;
    local_60.y = fVar13;
    local_60.x = table->BorderX2;
    local_48.y = fVar13;
    ImDrawList::AddLine(draw_list,&local_48,&local_60,table->BorderColorLight,1.0);
  }
  ImDrawList::PopClipRect(draw_list);
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter.SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->InnerRect.Min.y;
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount != -1 && table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || is_frozen_separator)
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), col, border_size);
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            inner_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, ~0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}